

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O3

void test_decimal128_to_string__scientific(void)

{
  int iVar1;
  char *pcVar2;
  ulong unaff_R14;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  char bid_string [43];
  bson_decimal128_t neg_tiny;
  bson_decimal128_t trailing_zero_no_decimal;
  bson_decimal128_t move_decimal_after;
  bson_decimal128_t move_decimal;
  bson_decimal128_t one_trailing_zero;
  bson_decimal128_t trailing_zero;
  bson_decimal128_t tiniest;
  bson_decimal128_t largest;
  bson_decimal128_t large;
  bson_decimal128_t tiny;
  bson_decimal128_t huge;
  char cStack_440;
  char cStack_43f;
  char cStack_43e;
  char cStack_43d;
  char cStack_43c;
  char cStack_43b;
  char cStack_43a;
  char cStack_439;
  char cStack_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  char cStack_421;
  char cStack_420;
  char cStack_41f;
  char cStack_41e;
  char cStack_41d;
  char cStack_41c;
  char cStack_41b;
  char cStack_41a;
  char cStack_419;
  char cStack_418;
  char cStack_417;
  char cStack_416;
  char cStack_415;
  char cStack_414;
  char cStack_413;
  char cStack_412;
  char cStack_411;
  char cStack_410;
  char cStack_40f;
  char cStack_40e;
  char cStack_40d;
  char cStack_40c;
  char cStack_40b;
  char cStack_40a;
  char cStack_409;
  char cStack_408;
  char cStack_407;
  char cStack_406;
  char cStack_405;
  char cStack_404;
  char cStack_403;
  char cStack_402;
  char cStack_401;
  code *pcStack_400;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  char cStack_3e0;
  char cStack_3df;
  char cStack_3de;
  char cStack_3dd;
  char cStack_3dc;
  char cStack_3db;
  char cStack_3da;
  char cStack_3d9;
  char cStack_3d8;
  char cStack_3d7;
  char cStack_3d6;
  char cStack_3d5;
  char cStack_3d4;
  char cStack_3d3;
  char cStack_3d2;
  char cStack_3d1;
  char cStack_3d0;
  char cStack_3cf;
  char cStack_3ce;
  char cStack_3cd;
  char cStack_3cc;
  char cStack_3cb;
  char cStack_3ca;
  char cStack_3c9;
  char cStack_3c8;
  char cStack_3c7;
  char cStack_3c6;
  char cStack_3c5;
  char cStack_3c4;
  char cStack_3c3;
  char cStack_3c2;
  char cStack_3c1;
  char cStack_3c0;
  char cStack_3bf;
  char cStack_3be;
  char cStack_3bd;
  char cStack_3bc;
  char cStack_3bb;
  char cStack_3ba;
  char cStack_3b9;
  char cStack_3b8;
  char cStack_3b7;
  char cStack_3b6;
  char cStack_3b5;
  char cStack_3b4;
  char cStack_3b3;
  char cStack_3b2;
  char cStack_3b1;
  char cStack_3b0;
  char cStack_3af;
  char cStack_3ae;
  char cStack_3ad;
  char cStack_3ac;
  char cStack_3ab;
  char cStack_3aa;
  char cStack_3a9;
  char cStack_3a8;
  char cStack_3a7;
  char cStack_3a6;
  char cStack_3a5;
  char cStack_3a4;
  char cStack_3a3;
  char cStack_3a2;
  char cStack_3a1;
  char *pcStack_3a0;
  code *pcStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  char cStack_380;
  char cStack_37f;
  char cStack_37e;
  char cStack_37d;
  char cStack_37c;
  char cStack_37b;
  char cStack_37a;
  char cStack_379;
  char cStack_378;
  char cStack_377;
  char cStack_376;
  char cStack_375;
  char cStack_374;
  char cStack_373;
  char cStack_372;
  char cStack_371;
  char cStack_370;
  char cStack_36f;
  char cStack_36e;
  char cStack_36d;
  char cStack_36c;
  char cStack_36b;
  char cStack_36a;
  char cStack_369;
  char cStack_368;
  char cStack_367;
  char cStack_366;
  char cStack_365;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  char cStack_361;
  char cStack_360;
  char cStack_35f;
  char cStack_35e;
  char cStack_35d;
  char cStack_35c;
  char cStack_35b;
  char cStack_35a;
  char cStack_359;
  char cStack_358;
  char cStack_357;
  char cStack_356;
  char cStack_355;
  char cStack_354;
  char cStack_353;
  char cStack_352;
  char cStack_351;
  char cStack_350;
  char cStack_34f;
  char cStack_34e;
  char cStack_34d;
  char cStack_34c;
  char cStack_34b;
  char cStack_34a;
  char cStack_349;
  char cStack_348;
  char cStack_347;
  char cStack_346;
  char cStack_345;
  char cStack_344;
  char cStack_343;
  char cStack_342;
  char cStack_341;
  char cStack_340;
  char cStack_33f;
  char cStack_33e;
  char cStack_33d;
  char cStack_33c;
  char cStack_33b;
  char cStack_33a;
  char cStack_339;
  char cStack_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  code *pcStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  char cStack_318;
  char cStack_317;
  char cStack_316;
  char cStack_315;
  char cStack_314;
  char cStack_313;
  char cStack_312;
  char cStack_311;
  char cStack_310;
  char cStack_30f;
  char cStack_30e;
  char cStack_30d;
  char cStack_30c;
  char cStack_30b;
  char cStack_30a;
  char cStack_309;
  undefined1 auStack_308 [16];
  undefined1 auStack_2f8 [16];
  char cStack_2e8;
  char cStack_2e7;
  char cStack_2e6;
  char cStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  char cStack_2e1;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  char cStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  char cStack_2d9;
  char cStack_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char cStack_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  char cStack_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  code *pcStack_2a8;
  undefined8 uStack_298;
  undefined8 uStack_290;
  char cStack_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char cStack_278;
  char cStack_277;
  char cStack_276;
  char cStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  char cStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  char cStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  char cStack_269;
  char cStack_268;
  char cStack_267;
  char cStack_266;
  char cStack_265;
  char cStack_264;
  char cStack_263;
  char cStack_262;
  char cStack_261;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  char cStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  char cStack_259;
  char cStack_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char cStack_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char cStack_238;
  char cStack_237;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  char cStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  char cStack_229;
  char cStack_228;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char cStack_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char cStack_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char cStack_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  undefined1 *puStack_1e8;
  code *pcStack_1e0;
  undefined1 auStack_1d0 [8];
  long lStack_1c8;
  undefined1 *puStack_1c0;
  code *pcStack_1b8;
  undefined1 auStack_1a8 [8];
  long lStack_1a0;
  undefined1 *puStack_198;
  code *pcStack_190;
  undefined1 auStack_180 [8];
  long lStack_178;
  short *psStack_170;
  code *pcStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  short sStack_140;
  undefined1 uStack_13e;
  int iStack_13d;
  undefined8 uStack_110;
  undefined8 uStack_108;
  code *pcStack_100;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  undefined4 local_e8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0x5ffe314dc6448d93;
  local_20 = 0x38c15b0a00000000;
  local_28 = 0;
  local_30 = 1;
  local_b8 = 0x8000000000000000;
  local_c0 = 1;
  local_38 = 0x3108000000000000;
  local_40 = 0x9184db63eb1;
  local_48 = 0x5fffed09bead87c0;
  local_50 = 0x378d8e63ffffffff;
  local_58 = 0x1ed09bead87c0;
  local_60 = 0x378d8e63ffffffff;
  local_68 = 0x304c000000000000;
  local_70 = 0x41a;
  local_78 = 0x3042000000000000;
  local_80 = 0x41a;
  local_88 = 0x3040000000000000;
  local_90 = 0x69;
  local_98 = 0x3042000000000000;
  local_a0 = 0x69;
  local_a8 = 0x3046000000000000;
  local_b0 = 1;
  pcStack_100 = (code *)0x127f1b;
  bson_decimal128_to_string(&local_20,&local_f8);
  pcStack_100 = (code *)0x127f2f;
  iVar1 = bcmp("1.000000000000000000000000000000000E+6144",&local_f8,0x2a);
  if (iVar1 == 0) {
    pcStack_100 = (code *)0x127f4a;
    bson_decimal128_to_string(&local_30,&local_f8);
    if (CONCAT17(cStack_f1,
                 CONCAT16(cStack_f2,
                          CONCAT15(cStack_f3,
                                   CONCAT14(cStack_f4,
                                            CONCAT13(cStack_f5,
                                                     CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8)
                                                             )))))) != 0x363731362d4531)
    goto LAB_00128104;
    unaff_R14 = 0x363731362d45312d;
    pcStack_100 = (code *)0x127f77;
    bson_decimal128_to_string(&local_c0,&local_f8);
    if (cStack_f0 != '\0' ||
        CONCAT17(cStack_f1,
                 CONCAT16(cStack_f2,
                          CONCAT15(cStack_f3,
                                   CONCAT14(cStack_f4,
                                            CONCAT13(cStack_f5,
                                                     CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8)
                                                             )))))) != 0x363731362d45312d)
    goto LAB_00128109;
    pcStack_100 = (code *)0x127f9a;
    bson_decimal128_to_string(&local_c0,&local_f8);
    unaff_R14 = CONCAT17(cStack_f1,
                         CONCAT16(cStack_f2,
                                  CONCAT15(cStack_f3,
                                           CONCAT14(cStack_f4,
                                                    CONCAT13(cStack_f5,
                                                             CONCAT12(cStack_f6,
                                                                      CONCAT11(cStack_f7,local_f8)))
                                                   )))) ^ 0x363731362d45312d;
    if (cStack_f0 != '\0' || unaff_R14 != 0) goto LAB_0012810e;
    pcStack_100 = (code *)0x127fbd;
    bson_decimal128_to_string(&local_40,&local_f8);
    auVar5[0] = -((char)local_e8 == '1');
    auVar5[1] = -((char)((uint)local_e8 >> 8) == '1');
    auVar5[2] = -((char)((uint)local_e8 >> 0x10) == '2');
    auVar5[3] = -((char)((uint)local_e8 >> 0x18) == '\0');
    auVar5[4] = 0xff;
    auVar5[5] = 0xff;
    auVar5[6] = 0xff;
    auVar5[7] = 0xff;
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar4[0] = -(local_f8 == '9');
    auVar4[1] = -(cStack_f7 == '.');
    auVar4[2] = -(cStack_f6 == '9');
    auVar4[3] = -(cStack_f5 == '9');
    auVar4[4] = -(cStack_f4 == '9');
    auVar4[5] = -(cStack_f3 == '9');
    auVar4[6] = -(cStack_f2 == '8');
    auVar4[7] = -(cStack_f1 == '7');
    auVar4[8] = -(cStack_f0 == '6');
    auVar4[9] = -(cStack_ef == '5');
    auVar4[10] = -(cStack_ee == '4');
    auVar4[0xb] = -(cStack_ed == '3');
    auVar4[0xc] = -(cStack_ec == '2');
    auVar4[0xd] = -(cStack_eb == '1');
    auVar4[0xe] = -(cStack_ea == 'E');
    auVar4[0xf] = -(cStack_e9 == '+');
    auVar4 = auVar4 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00128113;
    pcStack_100 = (code *)0x127ffc;
    bson_decimal128_to_string(&local_50,&local_f8);
    pcStack_100 = (code *)0x128010;
    iVar1 = bcmp("9.999999999999999999999999999999999E+6144",&local_f8,0x2a);
    if (iVar1 != 0) goto LAB_00128118;
    pcStack_100 = (code *)0x12802b;
    bson_decimal128_to_string(&local_60,&local_f8);
    pcStack_100 = (code *)0x12803f;
    iVar1 = bcmp("9.999999999999999999999999999999999E-6143",&local_f8,0x2a);
    if (iVar1 != 0) goto LAB_0012811d;
    pcStack_100 = (code *)0x12805a;
    bson_decimal128_to_string(&local_70,&local_f8);
    if (cStack_f0 != '\0' ||
        CONCAT17(cStack_f1,
                 CONCAT16(cStack_f2,
                          CONCAT15(cStack_f3,
                                   CONCAT14(cStack_f4,
                                            CONCAT13(cStack_f5,
                                                     CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8)
                                                             )))))) != 0x392b453035302e31)
    goto LAB_00128122;
    pcStack_100 = (code *)0x128084;
    bson_decimal128_to_string(&local_80,&local_f8);
    if (cStack_f0 != '\0' ||
        CONCAT17(cStack_f1,
                 CONCAT16(cStack_f2,
                          CONCAT15(cStack_f3,
                                   CONCAT14(cStack_f4,
                                            CONCAT13(cStack_f5,
                                                     CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8)
                                                             )))))) != 0x342b453035302e31)
    goto LAB_00128127;
    pcStack_100 = (code *)0x1280ae;
    bson_decimal128_to_string(&local_90,&local_f8);
    if (CONCAT13(cStack_f5,CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8))) != 0x353031)
    goto LAB_0012812c;
    pcStack_100 = (code *)0x1280c6;
    bson_decimal128_to_string(&local_a0,&local_f8);
    if (CONCAT17(cStack_f1,
                 CONCAT16(cStack_f2,
                          CONCAT15(cStack_f3,
                                   CONCAT14(cStack_f4,
                                            CONCAT13(cStack_f5,
                                                     CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8)
                                                             )))))) != 0x332b4535302e31)
    goto LAB_00128131;
    pcStack_100 = (code *)0x1280e5;
    bson_decimal128_to_string(&local_b0,&local_f8);
    if (cStack_f4 == '\0' &&
        CONCAT13(cStack_f5,CONCAT12(cStack_f6,CONCAT11(cStack_f7,local_f8))) == 0x332b4531) {
      return;
    }
  }
  else {
    pcStack_100 = (code *)0x128104;
    test_decimal128_to_string__scientific_cold_1();
LAB_00128104:
    pcStack_100 = (code *)0x128109;
    test_decimal128_to_string__scientific_cold_2();
LAB_00128109:
    pcStack_100 = (code *)0x12810e;
    test_decimal128_to_string__scientific_cold_3();
LAB_0012810e:
    pcStack_100 = (code *)0x128113;
    test_decimal128_to_string__scientific_cold_4();
LAB_00128113:
    pcStack_100 = (code *)0x128118;
    test_decimal128_to_string__scientific_cold_5();
LAB_00128118:
    pcStack_100 = (code *)0x12811d;
    test_decimal128_to_string__scientific_cold_6();
LAB_0012811d:
    pcStack_100 = (code *)0x128122;
    test_decimal128_to_string__scientific_cold_7();
LAB_00128122:
    pcStack_100 = (code *)0x128127;
    test_decimal128_to_string__scientific_cold_8();
LAB_00128127:
    pcStack_100 = (code *)0x12812c;
    test_decimal128_to_string__scientific_cold_9();
LAB_0012812c:
    pcStack_100 = (code *)0x128131;
    test_decimal128_to_string__scientific_cold_10();
LAB_00128131:
    pcStack_100 = (code *)0x128136;
    test_decimal128_to_string__scientific_cold_11();
  }
  pcStack_100 = test_decimal128_to_string__zeros;
  test_decimal128_to_string__scientific_cold_12();
  uStack_108 = 0x3040000000000000;
  uStack_110 = 0;
  uStack_148 = 0x3298000000000000;
  uStack_150 = 0;
  uStack_158 = 0x2b90000000000000;
  uStack_160 = 0;
  pcStack_168 = (code *)0x12818c;
  pcStack_100 = (code *)&local_f8;
  bson_decimal128_to_string(&uStack_110,&sStack_140);
  if (sStack_140 == 0x30) {
    pcStack_168 = (code *)0x1281a4;
    bson_decimal128_to_string(&uStack_150,&sStack_140);
    if (iStack_13d != 0x303033 ||
        CONCAT13((undefined1)iStack_13d,CONCAT12(uStack_13e,sStack_140)) != 0x332b4530)
    goto LAB_001281e5;
    pcStack_168 = (code *)0x1281c7;
    bson_decimal128_to_string(&uStack_160,&sStack_140);
    if (iStack_13d == 0x303036 &&
        CONCAT13((undefined1)iStack_13d,CONCAT12(uStack_13e,sStack_140)) == 0x362d4530) {
      return;
    }
  }
  else {
    pcStack_168 = (code *)0x1281e5;
    test_decimal128_to_string__zeros_cold_1();
LAB_001281e5:
    pcStack_168 = (code *)0x1281ea;
    test_decimal128_to_string__zeros_cold_2();
  }
  pcStack_168 = test_decimal128_from_string__invalid_inputs;
  test_decimal128_to_string__zeros_cold_3();
  pcStack_190 = (code *)0x128214;
  psStack_170 = &sStack_140;
  pcStack_168 = (code *)unaff_R14;
  bson_decimal128_from_string(".",auStack_180);
  if (lStack_178 == 0x7c00000000000000) {
    pcStack_190 = (code *)0x128232;
    bson_decimal128_from_string(".e",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283a5;
    pcStack_190 = (code *)0x128250;
    bson_decimal128_from_string("",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283aa;
    pcStack_190 = (code *)0x12826e;
    bson_decimal128_from_string("invalid",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283af;
    pcStack_190 = (code *)0x12828c;
    bson_decimal128_from_string("in",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283b4;
    pcStack_190 = (code *)0x1282aa;
    bson_decimal128_from_string("i",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283b9;
    pcStack_190 = (code *)0x1282c8;
    bson_decimal128_from_string("E02",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283be;
    pcStack_190 = (code *)0x1282e6;
    bson_decimal128_from_string("..1",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283c3;
    pcStack_190 = (code *)0x128304;
    bson_decimal128_from_string("1abcede",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283c8;
    pcStack_190 = (code *)0x128322;
    bson_decimal128_from_string("1.24abc",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283cd;
    pcStack_190 = (code *)0x128340;
    bson_decimal128_from_string("1.24abcE+02",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283d2;
    pcStack_190 = (code *)0x12835e;
    bson_decimal128_from_string("1.24E+02abc2d",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283d7;
    pcStack_190 = (code *)0x128378;
    bson_decimal128_from_string("E+02",auStack_180);
    if (lStack_178 != 0x7c00000000000000) goto LAB_001283dc;
    pcStack_190 = (code *)0x128392;
    bson_decimal128_from_string("e+02",auStack_180);
    if (lStack_178 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_190 = (code *)0x1283a5;
    test_decimal128_from_string__invalid_inputs_cold_1();
LAB_001283a5:
    pcStack_190 = (code *)0x1283aa;
    test_decimal128_from_string__invalid_inputs_cold_2();
LAB_001283aa:
    pcStack_190 = (code *)0x1283af;
    test_decimal128_from_string__invalid_inputs_cold_3();
LAB_001283af:
    pcStack_190 = (code *)0x1283b4;
    test_decimal128_from_string__invalid_inputs_cold_4();
LAB_001283b4:
    pcStack_190 = (code *)0x1283b9;
    test_decimal128_from_string__invalid_inputs_cold_5();
LAB_001283b9:
    pcStack_190 = (code *)0x1283be;
    test_decimal128_from_string__invalid_inputs_cold_6();
LAB_001283be:
    pcStack_190 = (code *)0x1283c3;
    test_decimal128_from_string__invalid_inputs_cold_7();
LAB_001283c3:
    pcStack_190 = (code *)0x1283c8;
    test_decimal128_from_string__invalid_inputs_cold_8();
LAB_001283c8:
    pcStack_190 = (code *)0x1283cd;
    test_decimal128_from_string__invalid_inputs_cold_9();
LAB_001283cd:
    pcStack_190 = (code *)0x1283d2;
    test_decimal128_from_string__invalid_inputs_cold_10();
LAB_001283d2:
    pcStack_190 = (code *)0x1283d7;
    test_decimal128_from_string__invalid_inputs_cold_11();
LAB_001283d7:
    pcStack_190 = (code *)0x1283dc;
    test_decimal128_from_string__invalid_inputs_cold_12();
LAB_001283dc:
    pcStack_190 = (code *)0x1283e1;
    test_decimal128_from_string__invalid_inputs_cold_13();
  }
  pcStack_190 = test_decimal128_from_string__nan;
  test_decimal128_from_string__invalid_inputs_cold_14();
  pcStack_190 = (code *)0x7c00000000000000;
  pcStack_1b8 = (code *)0x12840b;
  puStack_198 = auStack_180;
  bson_decimal128_from_string("NaN",auStack_1a8);
  if (lStack_1a0 == 0x7c00000000000000) {
    pcStack_1b8 = (code *)0x128429;
    bson_decimal128_from_string("+NaN",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_00128520;
    pcStack_1b8 = (code *)0x128447;
    bson_decimal128_from_string("-NaN",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_00128525;
    pcStack_1b8 = (code *)0x128465;
    bson_decimal128_from_string("-nan",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_0012852a;
    pcStack_1b8 = (code *)0x128483;
    bson_decimal128_from_string("1e",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_0012852f;
    pcStack_1b8 = (code *)0x1284a1;
    bson_decimal128_from_string("+nan",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_00128534;
    pcStack_1b8 = (code *)0x1284bf;
    bson_decimal128_from_string("nan",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_00128539;
    pcStack_1b8 = (code *)0x1284d9;
    bson_decimal128_from_string("Nan",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_0012853e;
    pcStack_1b8 = (code *)0x1284f3;
    bson_decimal128_from_string("+Nan",auStack_1a8);
    if (lStack_1a0 != 0x7c00000000000000) goto LAB_00128543;
    pcStack_1b8 = (code *)0x12850d;
    bson_decimal128_from_string("-Nan",auStack_1a8);
    if (lStack_1a0 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_1b8 = (code *)0x128520;
    test_decimal128_from_string__nan_cold_1();
LAB_00128520:
    pcStack_1b8 = (code *)0x128525;
    test_decimal128_from_string__nan_cold_2();
LAB_00128525:
    pcStack_1b8 = (code *)0x12852a;
    test_decimal128_from_string__nan_cold_3();
LAB_0012852a:
    pcStack_1b8 = (code *)0x12852f;
    test_decimal128_from_string__nan_cold_4();
LAB_0012852f:
    pcStack_1b8 = (code *)0x128534;
    test_decimal128_from_string__nan_cold_5();
LAB_00128534:
    pcStack_1b8 = (code *)0x128539;
    test_decimal128_from_string__nan_cold_6();
LAB_00128539:
    pcStack_1b8 = (code *)0x12853e;
    test_decimal128_from_string__nan_cold_7();
LAB_0012853e:
    pcStack_1b8 = (code *)0x128543;
    test_decimal128_from_string__nan_cold_8();
LAB_00128543:
    pcStack_1b8 = (code *)0x128548;
    test_decimal128_from_string__nan_cold_9();
  }
  pcStack_1b8 = test_decimal128_from_string__infinity;
  test_decimal128_from_string__nan_cold_10();
  pcStack_1b8 = (code *)0x7c00000000000000;
  uVar3 = 0x7800000000000000;
  pcStack_1e0 = (code *)0x128572;
  puStack_1c0 = auStack_1a8;
  bson_decimal128_from_string("Infinity",auStack_1d0);
  if (lStack_1c8 == 0x7800000000000000) {
    pcStack_1e0 = (code *)0x12858c;
    bson_decimal128_from_string("+Infinity",auStack_1d0);
    if (lStack_1c8 != 0x7800000000000000) goto LAB_001285f7;
    pcStack_1e0 = (code *)0x1285a6;
    bson_decimal128_from_string("+Inf",auStack_1d0);
    if (lStack_1c8 != 0x7800000000000000) goto LAB_001285fc;
    uVar3 = 0xf800000000000000;
    pcStack_1e0 = (code *)0x1285ca;
    bson_decimal128_from_string("-Inf",auStack_1d0);
    if (lStack_1c8 != -0x800000000000000) goto LAB_00128601;
    pcStack_1e0 = (code *)0x1285e4;
    bson_decimal128_from_string("-Infinity",auStack_1d0);
    if (lStack_1c8 == -0x800000000000000) {
      return;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1285f7;
    test_decimal128_from_string__infinity_cold_1();
LAB_001285f7:
    pcStack_1e0 = (code *)0x1285fc;
    test_decimal128_from_string__infinity_cold_2();
LAB_001285fc:
    pcStack_1e0 = (code *)0x128601;
    test_decimal128_from_string__infinity_cold_3();
LAB_00128601:
    pcStack_1e0 = (code *)0x128606;
    test_decimal128_from_string__infinity_cold_4();
  }
  pcStack_1e0 = test_decimal128_from_string__simple;
  test_decimal128_from_string__infinity_cold_5();
  pcStack_2a8 = (code *)0x128636;
  puStack_1e8 = auStack_1d0;
  pcStack_1e0 = (code *)uVar3;
  bson_decimal128_from_string("1",&cStack_1f8);
  pcStack_2a8 = (code *)0x12864a;
  bson_decimal128_from_string("-1",&cStack_208);
  pcStack_2a8 = (code *)0x12865e;
  bson_decimal128_from_string("0",&cStack_218);
  pcStack_2a8 = (code *)0x12866f;
  bson_decimal128_from_string("-0",&cStack_228);
  pcStack_2a8 = (code *)0x128680;
  bson_decimal128_from_string("12345678901234567",&cStack_238);
  pcStack_2a8 = (code *)0x128691;
  bson_decimal128_from_string("989898983458",&cStack_248);
  pcStack_2a8 = (code *)0x1286a2;
  bson_decimal128_from_string("-12345678901234567",&cStack_258);
  pcStack_2a8 = (code *)0x1286b3;
  bson_decimal128_from_string("0.12345",&cStack_268);
  pcStack_2a8 = (code *)0x1286c4;
  bson_decimal128_from_string("0.0012345",&cStack_278);
  pcStack_2a8 = (code *)0x1286d5;
  bson_decimal128_from_string("00012345678901234567",&cStack_288);
  uStack_290 = 0x3040000000000000;
  uStack_298 = 1;
  auVar6[0] = -(cStack_1f8 == '\x01');
  auVar6[1] = -(cStack_1f7 == '\0');
  auVar6[2] = -(cStack_1f6 == '\0');
  auVar6[3] = -(cStack_1f5 == '\0');
  auVar6[4] = -(cStack_1f4 == '\0');
  auVar6[5] = -(cStack_1f3 == '\0');
  auVar6[6] = -(cStack_1f2 == '\0');
  auVar6[7] = -(cStack_1f1 == '\0');
  auVar6[8] = -(cStack_1f0 == '\0');
  auVar6[9] = -(cStack_1ef == '\0');
  auVar6[10] = -(cStack_1ee == '\0');
  auVar6[0xb] = -(cStack_1ed == '\0');
  auVar6[0xc] = -(cStack_1ec == '\0');
  auVar6[0xd] = -(cStack_1eb == '\0');
  auVar6[0xe] = -(cStack_1ea == '@');
  auVar6[0xf] = -(cStack_1e9 == '0');
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_290 = 0xb040000000000000;
    uStack_298 = 1;
    auVar7[0] = -(cStack_208 == '\x01');
    auVar7[1] = -(cStack_207 == '\0');
    auVar7[2] = -(cStack_206 == '\0');
    auVar7[3] = -(cStack_205 == '\0');
    auVar7[4] = -(cStack_204 == '\0');
    auVar7[5] = -(cStack_203 == '\0');
    auVar7[6] = -(cStack_202 == '\0');
    auVar7[7] = -(cStack_201 == '\0');
    auVar7[8] = -(cStack_200 == '\0');
    auVar7[9] = -(cStack_1ff == '\0');
    auVar7[10] = -(cStack_1fe == '\0');
    auVar7[0xb] = -(cStack_1fd == '\0');
    auVar7[0xc] = -(cStack_1fc == '\0');
    auVar7[0xd] = -(cStack_1fb == '\0');
    auVar7[0xe] = -(cStack_1fa == '@');
    auVar7[0xf] = -(cStack_1f9 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288ca;
    uStack_290 = 0x3040000000000000;
    uStack_298 = 0;
    auVar8[0] = -(cStack_218 == '\0');
    auVar8[1] = -(cStack_217 == '\0');
    auVar8[2] = -(cStack_216 == '\0');
    auVar8[3] = -(cStack_215 == '\0');
    auVar8[4] = -(cStack_214 == '\0');
    auVar8[5] = -(cStack_213 == '\0');
    auVar8[6] = -(cStack_212 == '\0');
    auVar8[7] = -(cStack_211 == '\0');
    auVar8[8] = -(cStack_210 == '\0');
    auVar8[9] = -(cStack_20f == '\0');
    auVar8[10] = -(cStack_20e == '\0');
    auVar8[0xb] = -(cStack_20d == '\0');
    auVar8[0xc] = -(cStack_20c == '\0');
    auVar8[0xd] = -(cStack_20b == '\0');
    auVar8[0xe] = -(cStack_20a == '@');
    auVar8[0xf] = -(cStack_209 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288cf;
    uStack_290 = 0xb040000000000000;
    uStack_298 = 0;
    auVar9[0] = -(cStack_228 == '\0');
    auVar9[1] = -(cStack_227 == '\0');
    auVar9[2] = -(cStack_226 == '\0');
    auVar9[3] = -(cStack_225 == '\0');
    auVar9[4] = -(cStack_224 == '\0');
    auVar9[5] = -(cStack_223 == '\0');
    auVar9[6] = -(cStack_222 == '\0');
    auVar9[7] = -(cStack_221 == '\0');
    auVar9[8] = -(cStack_220 == '\0');
    auVar9[9] = -(cStack_21f == '\0');
    auVar9[10] = -(cStack_21e == '\0');
    auVar9[0xb] = -(cStack_21d == '\0');
    auVar9[0xc] = -(cStack_21c == '\0');
    auVar9[0xd] = -(cStack_21b == '\0');
    auVar9[0xe] = -(cStack_21a == '@');
    auVar9[0xf] = -(cStack_219 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288d4;
    uStack_290 = 0x3040000000000000;
    uStack_298 = 0x2bdc545d6b4b87;
    auVar10[0] = -(cStack_238 == -0x79);
    auVar10[1] = -(cStack_237 == 'K');
    auVar10[2] = -(cStack_236 == 'k');
    auVar10[3] = -(cStack_235 == ']');
    auVar10[4] = -(cStack_234 == 'T');
    auVar10[5] = -(cStack_233 == -0x24);
    auVar10[6] = -(cStack_232 == '+');
    auVar10[7] = -(cStack_231 == '\0');
    auVar10[8] = -(cStack_230 == '\0');
    auVar10[9] = -(cStack_22f == '\0');
    auVar10[10] = -(cStack_22e == '\0');
    auVar10[0xb] = -(cStack_22d == '\0');
    auVar10[0xc] = -(cStack_22c == '\0');
    auVar10[0xd] = -(cStack_22b == '\0');
    auVar10[0xe] = -(cStack_22a == '@');
    auVar10[0xf] = -(cStack_229 == '0');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288d9;
    uStack_290 = 0x3040000000000000;
    uStack_298 = 0xe67a93c822;
    auVar11[0] = -(cStack_248 == '\"');
    auVar11[1] = -(cStack_247 == -0x38);
    auVar11[2] = -(cStack_246 == -0x6d);
    auVar11[3] = -(cStack_245 == 'z');
    auVar11[4] = -(cStack_244 == -0x1a);
    auVar11[5] = -(cStack_243 == '\0');
    auVar11[6] = -(cStack_242 == '\0');
    auVar11[7] = -(cStack_241 == '\0');
    auVar11[8] = -(cStack_240 == '\0');
    auVar11[9] = -(cStack_23f == '\0');
    auVar11[10] = -(cStack_23e == '\0');
    auVar11[0xb] = -(cStack_23d == '\0');
    auVar11[0xc] = -(cStack_23c == '\0');
    auVar11[0xd] = -(cStack_23b == '\0');
    auVar11[0xe] = -(cStack_23a == '@');
    auVar11[0xf] = -(cStack_239 == '0');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288de;
    uStack_290 = 0xb040000000000000;
    uStack_298 = 0x2bdc545d6b4b87;
    auVar12[0] = -(cStack_258 == -0x79);
    auVar12[1] = -(cStack_257 == 'K');
    auVar12[2] = -(cStack_256 == 'k');
    auVar12[3] = -(cStack_255 == ']');
    auVar12[4] = -(cStack_254 == 'T');
    auVar12[5] = -(cStack_253 == -0x24);
    auVar12[6] = -(cStack_252 == '+');
    auVar12[7] = -(cStack_251 == '\0');
    auVar12[8] = -(cStack_250 == '\0');
    auVar12[9] = -(cStack_24f == '\0');
    auVar12[10] = -(cStack_24e == '\0');
    auVar12[0xb] = -(cStack_24d == '\0');
    auVar12[0xc] = -(cStack_24c == '\0');
    auVar12[0xd] = -(cStack_24b == '\0');
    auVar12[0xe] = -(cStack_24a == '@');
    auVar12[0xf] = -(cStack_249 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288e3;
    uStack_290 = 0x3036000000000000;
    uStack_298 = 0x3039;
    auVar13[0] = -(cStack_268 == '9');
    auVar13[1] = -(cStack_267 == '0');
    auVar13[2] = -(cStack_266 == '\0');
    auVar13[3] = -(cStack_265 == '\0');
    auVar13[4] = -(cStack_264 == '\0');
    auVar13[5] = -(cStack_263 == '\0');
    auVar13[6] = -(cStack_262 == '\0');
    auVar13[7] = -(cStack_261 == '\0');
    auVar13[8] = -(cStack_260 == '\0');
    auVar13[9] = -(cStack_25f == '\0');
    auVar13[10] = -(cStack_25e == '\0');
    auVar13[0xb] = -(cStack_25d == '\0');
    auVar13[0xc] = -(cStack_25c == '\0');
    auVar13[0xd] = -(cStack_25b == '\0');
    auVar13[0xe] = -(cStack_25a == '6');
    auVar13[0xf] = -(cStack_259 == '0');
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288e8;
    uStack_290 = 0x3032000000000000;
    uStack_298 = 0x3039;
    auVar14[0] = -(cStack_278 == '9');
    auVar14[1] = -(cStack_277 == '0');
    auVar14[2] = -(cStack_276 == '\0');
    auVar14[3] = -(cStack_275 == '\0');
    auVar14[4] = -(cStack_274 == '\0');
    auVar14[5] = -(cStack_273 == '\0');
    auVar14[6] = -(cStack_272 == '\0');
    auVar14[7] = -(cStack_271 == '\0');
    auVar14[8] = -(cStack_270 == '\0');
    auVar14[9] = -(cStack_26f == '\0');
    auVar14[10] = -(cStack_26e == '\0');
    auVar14[0xb] = -(cStack_26d == '\0');
    auVar14[0xc] = -(cStack_26c == '\0');
    auVar14[0xd] = -(cStack_26b == '\0');
    auVar14[0xe] = -(cStack_26a == '2');
    auVar14[0xf] = -(cStack_269 == '0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288ed;
    uStack_290 = 0x3040000000000000;
    uStack_298 = 0x2bdc545d6b4b87;
    auVar15[0] = -(cStack_288 == -0x79);
    auVar15[1] = -(cStack_287 == 'K');
    auVar15[2] = -(cStack_286 == 'k');
    auVar15[3] = -(cStack_285 == ']');
    auVar15[4] = -(cStack_284 == 'T');
    auVar15[5] = -(cStack_283 == -0x24);
    auVar15[6] = -(cStack_282 == '+');
    auVar15[7] = -(cStack_281 == '\0');
    auVar15[8] = -(cStack_280 == '\0');
    auVar15[9] = -(cStack_27f == '\0');
    auVar15[10] = -(cStack_27e == '\0');
    auVar15[0xb] = -(cStack_27d == '\0');
    auVar15[0xc] = -(cStack_27c == '\0');
    auVar15[0xd] = -(cStack_27b == '\0');
    auVar15[0xe] = -(cStack_27a == '@');
    auVar15[0xf] = -(cStack_279 == '0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_2a8 = (code *)0x1288ca;
    test_decimal128_from_string__simple_cold_1();
LAB_001288ca:
    pcStack_2a8 = (code *)0x1288cf;
    test_decimal128_from_string__simple_cold_2();
LAB_001288cf:
    pcStack_2a8 = (code *)0x1288d4;
    test_decimal128_from_string__simple_cold_3();
LAB_001288d4:
    pcStack_2a8 = (code *)0x1288d9;
    test_decimal128_from_string__simple_cold_4();
LAB_001288d9:
    pcStack_2a8 = (code *)0x1288de;
    test_decimal128_from_string__simple_cold_5();
LAB_001288de:
    pcStack_2a8 = (code *)0x1288e3;
    test_decimal128_from_string__simple_cold_6();
LAB_001288e3:
    pcStack_2a8 = (code *)0x1288e8;
    test_decimal128_from_string__simple_cold_7();
LAB_001288e8:
    pcStack_2a8 = (code *)0x1288ed;
    test_decimal128_from_string__simple_cold_8();
LAB_001288ed:
    pcStack_2a8 = (code *)0x1288f2;
    test_decimal128_from_string__simple_cold_9();
  }
  pcStack_2a8 = test_decimal128_from_string__scientific;
  test_decimal128_from_string__simple_cold_10();
  pcVar2 = &cStack_2b8;
  pcStack_330 = (code *)0x128913;
  pcStack_2a8 = (code *)&cStack_1f8;
  bson_decimal128_from_string("10e0",pcVar2);
  pcStack_330 = (code *)0x128924;
  bson_decimal128_from_string("1e1",&cStack_2e8);
  pcStack_330 = (code *)0x128935;
  bson_decimal128_from_string("10e-1",auStack_2f8);
  uStack_320 = 0x3040000000000000;
  uStack_328 = 10;
  auVar16[0] = -(cStack_2b8 == '\n');
  auVar16[1] = -(cStack_2b7 == '\0');
  auVar16[2] = -(cStack_2b6 == '\0');
  auVar16[3] = -(cStack_2b5 == '\0');
  auVar16[4] = -(cStack_2b4 == '\0');
  auVar16[5] = -(cStack_2b3 == '\0');
  auVar16[6] = -(cStack_2b2 == '\0');
  auVar16[7] = -(cStack_2b1 == '\0');
  auVar16[8] = -(cStack_2b0 == '\0');
  auVar16[9] = -(cStack_2af == '\0');
  auVar16[10] = -(cStack_2ae == '\0');
  auVar16[0xb] = -(cStack_2ad == '\0');
  auVar16[0xc] = -(cStack_2ac == '\0');
  auVar16[0xd] = -(cStack_2ab == '\0');
  auVar16[0xe] = -(cStack_2aa == '@');
  auVar16[0xf] = -(cStack_2a9 == '0');
  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_320 = 0x3042000000000000;
    uStack_328 = 1;
    auVar17[0] = -(cStack_2e8 == '\x01');
    auVar17[1] = -(cStack_2e7 == '\0');
    auVar17[2] = -(cStack_2e6 == '\0');
    auVar17[3] = -(cStack_2e5 == '\0');
    auVar17[4] = -(cStack_2e4 == '\0');
    auVar17[5] = -(cStack_2e3 == '\0');
    auVar17[6] = -(cStack_2e2 == '\0');
    auVar17[7] = -(cStack_2e1 == '\0');
    auVar17[8] = -(cStack_2e0 == '\0');
    auVar17[9] = -(cStack_2df == '\0');
    auVar17[10] = -(cStack_2de == '\0');
    auVar17[0xb] = -(cStack_2dd == '\0');
    auVar17[0xc] = -(cStack_2dc == '\0');
    auVar17[0xd] = -(cStack_2db == '\0');
    auVar17[0xe] = -(cStack_2da == 'B');
    auVar17[0xf] = -(cStack_2d9 == '0');
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128af2;
    uStack_320 = 0x303e000000000000;
    uStack_328 = 10;
    auVar18[0] = -(auStack_2f8[0] == '\n');
    auVar18[1] = -(auStack_2f8[1] == '\0');
    auVar18[2] = -(auStack_2f8[2] == '\0');
    auVar18[3] = -(auStack_2f8[3] == '\0');
    auVar18[4] = -(auStack_2f8[4] == '\0');
    auVar18[5] = -(auStack_2f8[5] == '\0');
    auVar18[6] = -(auStack_2f8[6] == '\0');
    auVar18[7] = -(auStack_2f8[7] == '\0');
    auVar18[8] = -(auStack_2f8[8] == '\0');
    auVar18[9] = -(auStack_2f8[9] == '\0');
    auVar18[10] = -(auStack_2f8[10] == '\0');
    auVar18[0xb] = -(auStack_2f8[0xb] == '\0');
    auVar18[0xc] = -(auStack_2f8[0xc] == '\0');
    auVar18[0xd] = -(auStack_2f8[0xd] == '\0');
    auVar18[0xe] = -(auStack_2f8[0xe] == '>');
    auVar18[0xf] = -(auStack_2f8[0xf] == '0');
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128af7;
    pcVar2 = &cStack_2c8;
    pcStack_330 = (code *)0x1289e6;
    bson_decimal128_from_string("12345678901234567e6111",pcVar2);
    pcStack_330 = (code *)0x1289f7;
    bson_decimal128_from_string("1e-6176",auStack_308);
    uStack_320 = 0x5ffe000000000000;
    uStack_328 = 0x2bdc545d6b4b87;
    auVar19[0] = -(cStack_2c8 == -0x79);
    auVar19[1] = -(cStack_2c7 == 'K');
    auVar19[2] = -(cStack_2c6 == 'k');
    auVar19[3] = -(cStack_2c5 == ']');
    auVar19[4] = -(cStack_2c4 == 'T');
    auVar19[5] = -(cStack_2c3 == -0x24);
    auVar19[6] = -(cStack_2c2 == '+');
    auVar19[7] = -(cStack_2c1 == '\0');
    auVar19[8] = -(cStack_2c0 == '\0');
    auVar19[9] = -(cStack_2bf == '\0');
    auVar19[10] = -(cStack_2be == '\0');
    auVar19[0xb] = -(cStack_2bd == '\0');
    auVar19[0xc] = -(cStack_2bc == '\0');
    auVar19[0xd] = -(cStack_2bb == '\0');
    auVar19[0xe] = -(cStack_2ba == -2);
    auVar19[0xf] = -(cStack_2b9 == '_');
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128afc;
    uStack_320 = 0;
    uStack_328 = 1;
    auVar20[0] = -(auStack_308[0] == '\x01');
    auVar20[1] = -(auStack_308[1] == '\0');
    auVar20[2] = -(auStack_308[2] == '\0');
    auVar20[3] = -(auStack_308[3] == '\0');
    auVar20[4] = -(auStack_308[4] == '\0');
    auVar20[5] = -(auStack_308[5] == '\0');
    auVar20[6] = -(auStack_308[6] == '\0');
    auVar20[7] = -(auStack_308[7] == '\0');
    auVar20[8] = -(auStack_308[8] == '\0');
    auVar20[9] = -(auStack_308[9] == '\0');
    auVar20[10] = -(auStack_308[10] == '\0');
    auVar20[0xb] = -(auStack_308[0xb] == '\0');
    auVar20[0xc] = -(auStack_308[0xc] == '\0');
    auVar20[0xd] = -(auStack_308[0xd] == '\0');
    auVar20[0xe] = -(auStack_308[0xe] == '\0');
    auVar20[0xf] = -(auStack_308[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b01;
    pcVar2 = &cStack_2d8;
    pcStack_330 = (code *)0x128a73;
    bson_decimal128_from_string("-100E-10",pcVar2);
    pcStack_330 = (code *)0x128a84;
    bson_decimal128_from_string("10.50E8",&cStack_318);
    uStack_320 = 0xb02c000000000000;
    uStack_328 = 100;
    auVar21[0] = -(cStack_2d8 == 'd');
    auVar21[1] = -(cStack_2d7 == '\0');
    auVar21[2] = -(cStack_2d6 == '\0');
    auVar21[3] = -(cStack_2d5 == '\0');
    auVar21[4] = -(cStack_2d4 == '\0');
    auVar21[5] = -(cStack_2d3 == '\0');
    auVar21[6] = -(cStack_2d2 == '\0');
    auVar21[7] = -(cStack_2d1 == '\0');
    auVar21[8] = -(cStack_2d0 == '\0');
    auVar21[9] = -(cStack_2cf == '\0');
    auVar21[10] = -(cStack_2ce == '\0');
    auVar21[0xb] = -(cStack_2cd == '\0');
    auVar21[0xc] = -(cStack_2cc == '\0');
    auVar21[0xd] = -(cStack_2cb == '\0');
    auVar21[0xe] = -(cStack_2ca == ',');
    auVar21[0xf] = -(cStack_2c9 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b06;
    uStack_320 = 0x304c000000000000;
    uStack_328 = 0x41a;
    auVar22[0] = -(cStack_318 == '\x1a');
    auVar22[1] = -(cStack_317 == '\x04');
    auVar22[2] = -(cStack_316 == '\0');
    auVar22[3] = -(cStack_315 == '\0');
    auVar22[4] = -(cStack_314 == '\0');
    auVar22[5] = -(cStack_313 == '\0');
    auVar22[6] = -(cStack_312 == '\0');
    auVar22[7] = -(cStack_311 == '\0');
    auVar22[8] = -(cStack_310 == '\0');
    auVar22[9] = -(cStack_30f == '\0');
    auVar22[10] = -(cStack_30e == '\0');
    auVar22[0xb] = -(cStack_30d == '\0');
    auVar22[0xc] = -(cStack_30c == '\0');
    auVar22[0xd] = -(cStack_30b == '\0');
    auVar22[0xe] = -(cStack_30a == 'L');
    auVar22[0xf] = -(cStack_309 == '0');
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_330 = (code *)0x128af2;
    test_decimal128_from_string__scientific_cold_1();
LAB_00128af2:
    pcStack_330 = (code *)0x128af7;
    test_decimal128_from_string__scientific_cold_2();
LAB_00128af7:
    pcStack_330 = (code *)0x128afc;
    test_decimal128_from_string__scientific_cold_3();
LAB_00128afc:
    pcStack_330 = (code *)0x128b01;
    test_decimal128_from_string__scientific_cold_4();
LAB_00128b01:
    pcStack_330 = (code *)0x128b06;
    test_decimal128_from_string__scientific_cold_5();
LAB_00128b06:
    pcStack_330 = (code *)0x128b0b;
    test_decimal128_from_string__scientific_cold_6();
  }
  pcStack_330 = test_decimal128_from_string__large;
  test_decimal128_from_string__scientific_cold_7();
  pcStack_398 = (code *)0x128b29;
  pcStack_330 = (code *)pcVar2;
  bson_decimal128_from_string("12345689012345789012345",&cStack_340);
  pcStack_398 = (code *)0x128b3a;
  bson_decimal128_from_string("1234567890123456789012345678901234",&cStack_350);
  pcStack_398 = (code *)0x128b4b;
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&cStack_360);
  pcStack_398 = (code *)0x128b5c;
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&cStack_370);
  pcStack_398 = (code *)0x128b6d;
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&cStack_380);
  uStack_388 = 0x304000000000029d;
  uStack_390 = 0x42da3a76f9e0d979;
  auVar23[0] = -(cStack_340 == 'y');
  auVar23[1] = -(cStack_33f == -0x27);
  auVar23[2] = -(cStack_33e == -0x20);
  auVar23[3] = -(cStack_33d == -7);
  auVar23[4] = -(cStack_33c == 'v');
  auVar23[5] = -(cStack_33b == ':');
  auVar23[6] = -(cStack_33a == -0x26);
  auVar23[7] = -(cStack_339 == 'B');
  auVar23[8] = -(cStack_338 == -99);
  auVar23[9] = -(cStack_337 == '\x02');
  auVar23[10] = -(cStack_336 == '\0');
  auVar23[0xb] = -(cStack_335 == '\0');
  auVar23[0xc] = -(cStack_334 == '\0');
  auVar23[0xd] = -(cStack_333 == '\0');
  auVar23[0xe] = -(cStack_332 == '@');
  auVar23[0xf] = -(cStack_331 == '0');
  if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_388 = 0x30403cde6fff9732;
    uStack_390 = 0xde825cd07e96aff2;
    auVar24[0] = -(cStack_350 == -0xe);
    auVar24[1] = -(cStack_34f == -0x51);
    auVar24[2] = -(cStack_34e == -0x6a);
    auVar24[3] = -(cStack_34d == '~');
    auVar24[4] = -(cStack_34c == -0x30);
    auVar24[5] = -(cStack_34b == '\\');
    auVar24[6] = -(cStack_34a == -0x7e);
    auVar24[7] = -(cStack_349 == -0x22);
    auVar24[8] = -(cStack_348 == '2');
    auVar24[9] = -(cStack_347 == -0x69);
    auVar24[10] = -(cStack_346 == -1);
    auVar24[0xb] = -(cStack_345 == 'o');
    auVar24[0xc] = -(cStack_344 == -0x22);
    auVar24[0xd] = -(cStack_343 == '<');
    auVar24[0xe] = -(cStack_342 == '@');
    auVar24[0xf] = -(cStack_341 == '0');
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c82;
    uStack_388 = 0x5fffed09bead87c0;
    uStack_390 = 0x378d8e63ffffffff;
    auVar25[0] = -(cStack_360 == -1);
    auVar25[1] = -(cStack_35f == -1);
    auVar25[2] = -(cStack_35e == -1);
    auVar25[3] = -(cStack_35d == -1);
    auVar25[4] = -(cStack_35c == 'c');
    auVar25[5] = -(cStack_35b == -0x72);
    auVar25[6] = -(cStack_35a == -0x73);
    auVar25[7] = -(cStack_359 == '7');
    auVar25[8] = -(cStack_358 == -0x40);
    auVar25[9] = -(cStack_357 == -0x79);
    auVar25[10] = -(cStack_356 == -0x53);
    auVar25[0xb] = -(cStack_355 == -0x42);
    auVar25[0xc] = -(cStack_354 == '\t');
    auVar25[0xd] = -(cStack_353 == -0x13);
    auVar25[0xe] = -(cStack_352 == -1);
    auVar25[0xf] = -(cStack_351 == '_');
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c87;
    uStack_388 = 0x1ed09bead87c0;
    uStack_390 = 0x378d8e63ffffffff;
    auVar26[0] = -(cStack_370 == -1);
    auVar26[1] = -(cStack_36f == -1);
    auVar26[2] = -(cStack_36e == -1);
    auVar26[3] = -(cStack_36d == -1);
    auVar26[4] = -(cStack_36c == 'c');
    auVar26[5] = -(cStack_36b == -0x72);
    auVar26[6] = -(cStack_36a == -0x73);
    auVar26[7] = -(cStack_369 == '7');
    auVar26[8] = -(cStack_368 == -0x40);
    auVar26[9] = -(cStack_367 == -0x79);
    auVar26[10] = -(cStack_366 == -0x53);
    auVar26[0xb] = -(cStack_365 == -0x42);
    auVar26[0xc] = -(cStack_364 == '\t');
    auVar26[0xd] = -(cStack_363 == -0x13);
    auVar26[0xe] = -(cStack_362 == '\x01');
    auVar26[0xf] = -(cStack_361 == '\0');
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c8c;
    uStack_388 = 0x3040ffffffffffff;
    uStack_390 = 0xffffffffffffffff;
    auVar27[0] = -(cStack_380 == -1);
    auVar27[1] = -(cStack_37f == -1);
    auVar27[2] = -(cStack_37e == -1);
    auVar27[3] = -(cStack_37d == -1);
    auVar27[4] = -(cStack_37c == -1);
    auVar27[5] = -(cStack_37b == -1);
    auVar27[6] = -(cStack_37a == -1);
    auVar27[7] = -(cStack_379 == -1);
    auVar27[8] = -(cStack_378 == -1);
    auVar27[9] = -(cStack_377 == -1);
    auVar27[10] = -(cStack_376 == -1);
    auVar27[0xb] = -(cStack_375 == -1);
    auVar27[0xc] = -(cStack_374 == -1);
    auVar27[0xd] = -(cStack_373 == -1);
    auVar27[0xe] = -(cStack_372 == '@');
    auVar27[0xf] = -(cStack_371 == '0');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_398 = (code *)0x128c82;
    test_decimal128_from_string__large_cold_1();
LAB_00128c82:
    pcStack_398 = (code *)0x128c87;
    test_decimal128_from_string__large_cold_2();
LAB_00128c87:
    pcStack_398 = (code *)0x128c8c;
    test_decimal128_from_string__large_cold_3();
LAB_00128c8c:
    pcStack_398 = (code *)0x128c91;
    test_decimal128_from_string__large_cold_4();
  }
  pcStack_398 = test_decimal128_from_string__exponent_normalization;
  test_decimal128_from_string__large_cold_5();
  pcStack_398 = (code *)0x3040000000000000;
  pcStack_400 = (code *)0x128cbb;
  pcStack_3a0 = &cStack_340;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_3b0);
  pcStack_400 = (code *)0x128ccc;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_3c0);
  pcStack_400 = (code *)0x128cdd;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_3d0);
  pcStack_400 = (code *)0x128cee;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_3e0);
  uStack_3e8 = 0x304c314dc6448d93;
  uStack_3f0 = 0x38c15b0a00000000;
  auVar28[0] = -(cStack_3b0 == '\0');
  auVar28[1] = -(cStack_3af == '\0');
  auVar28[2] = -(cStack_3ae == '\0');
  auVar28[3] = -(cStack_3ad == '\0');
  auVar28[4] = -(cStack_3ac == '\n');
  auVar28[5] = -(cStack_3ab == '[');
  auVar28[6] = -(cStack_3aa == -0x3f);
  auVar28[7] = -(cStack_3a9 == '8');
  auVar28[8] = -(cStack_3a8 == -0x6d);
  auVar28[9] = -(cStack_3a7 == -0x73);
  auVar28[10] = -(cStack_3a6 == 'D');
  auVar28[0xb] = -(cStack_3a5 == -0x3a);
  auVar28[0xc] = -(cStack_3a4 == 'M');
  auVar28[0xd] = -(cStack_3a3 == '1');
  auVar28[0xe] = -(cStack_3a2 == 'L');
  auVar28[0xf] = -(cStack_3a1 == '0');
  if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_3e8 = 0x3042314dc6448d93;
    uStack_3f0 = 0x38c15b0a00000000;
    auVar29[0] = -(cStack_3c0 == '\0');
    auVar29[1] = -(cStack_3bf == '\0');
    auVar29[2] = -(cStack_3be == '\0');
    auVar29[3] = -(cStack_3bd == '\0');
    auVar29[4] = -(cStack_3bc == '\n');
    auVar29[5] = -(cStack_3bb == '[');
    auVar29[6] = -(cStack_3ba == -0x3f);
    auVar29[7] = -(cStack_3b9 == '8');
    auVar29[8] = -(cStack_3b8 == -0x6d);
    auVar29[9] = -(cStack_3b7 == -0x73);
    auVar29[10] = -(cStack_3b6 == 'D');
    auVar29[0xb] = -(cStack_3b5 == -0x3a);
    auVar29[0xc] = -(cStack_3b4 == 'M');
    auVar29[0xd] = -(cStack_3b3 == '1');
    auVar29[0xe] = -(cStack_3b2 == 'B');
    auVar29[0xf] = -(cStack_3b1 == '0');
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128db9;
    uStack_3e8 = 0x3040314dc6448d93;
    uStack_3f0 = 0x38c15b0a00000000;
    auVar30[0] = -(cStack_3d0 == '\0');
    auVar30[1] = -(cStack_3cf == '\0');
    auVar30[2] = -(cStack_3ce == '\0');
    auVar30[3] = -(cStack_3cd == '\0');
    auVar30[4] = -(cStack_3cc == '\n');
    auVar30[5] = -(cStack_3cb == '[');
    auVar30[6] = -(cStack_3ca == -0x3f);
    auVar30[7] = -(cStack_3c9 == '8');
    auVar30[8] = -(cStack_3c8 == -0x6d);
    auVar30[9] = -(cStack_3c7 == -0x73);
    auVar30[10] = -(cStack_3c6 == 'D');
    auVar30[0xb] = -(cStack_3c5 == -0x3a);
    auVar30[0xc] = -(cStack_3c4 == 'M');
    auVar30[0xd] = -(cStack_3c3 == '1');
    auVar30[0xe] = -(cStack_3c2 == '@');
    auVar30[0xf] = -(cStack_3c1 == '0');
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128dbe;
    uStack_3e8 = 0x37cc314dc6448d93;
    uStack_3f0 = 0x38c15b0a00000000;
    auVar31[0] = -(cStack_3e0 == '\0');
    auVar31[1] = -(cStack_3df == '\0');
    auVar31[2] = -(cStack_3de == '\0');
    auVar31[3] = -(cStack_3dd == '\0');
    auVar31[4] = -(cStack_3dc == '\n');
    auVar31[5] = -(cStack_3db == '[');
    auVar31[6] = -(cStack_3da == -0x3f);
    auVar31[7] = -(cStack_3d9 == '8');
    auVar31[8] = -(cStack_3d8 == -0x6d);
    auVar31[9] = -(cStack_3d7 == -0x73);
    auVar31[10] = -(cStack_3d6 == 'D');
    auVar31[0xb] = -(cStack_3d5 == -0x3a);
    auVar31[0xc] = -(cStack_3d4 == 'M');
    auVar31[0xd] = -(cStack_3d3 == '1');
    auVar31[0xe] = -(cStack_3d2 == -0x34);
    auVar31[0xf] = -(cStack_3d1 == '7');
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_400 = (code *)0x128db9;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128db9:
    pcStack_400 = (code *)0x128dbe;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128dbe:
    pcStack_400 = (code *)0x128dc3;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_400 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_400 = (code *)&cStack_3b0;
  bson_decimal128_from_string("0",&cStack_410);
  bson_decimal128_from_string("0e-611",&cStack_420);
  bson_decimal128_from_string("0e+6000",&cStack_430);
  pcVar2 = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_440);
  auVar32[0] = -(cStack_410 == '\0');
  auVar32[1] = -(cStack_40f == '\0');
  auVar32[2] = -(cStack_40e == '\0');
  auVar32[3] = -(cStack_40d == '\0');
  auVar32[4] = -(cStack_40c == '\0');
  auVar32[5] = -(cStack_40b == '\0');
  auVar32[6] = -(cStack_40a == '\0');
  auVar32[7] = -(cStack_409 == '\0');
  auVar32[8] = -(cStack_408 == '\0');
  auVar32[9] = -(cStack_407 == '\0');
  auVar32[10] = -(cStack_406 == '\0');
  auVar32[0xb] = -(cStack_405 == '\0');
  auVar32[0xc] = -(cStack_404 == '\0');
  auVar32[0xd] = -(cStack_403 == '\0');
  auVar32[0xe] = -(cStack_402 == '@');
  auVar32[0xf] = -(cStack_401 == '0');
  if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar33[0] = -(cStack_420 == '\0');
    auVar33[1] = -(cStack_41f == '\0');
    auVar33[2] = -(cStack_41e == '\0');
    auVar33[3] = -(cStack_41d == '\0');
    auVar33[4] = -(cStack_41c == '\0');
    auVar33[5] = -(cStack_41b == '\0');
    auVar33[6] = -(cStack_41a == '\0');
    auVar33[7] = -(cStack_419 == '\0');
    auVar33[8] = -(cStack_418 == '\0');
    auVar33[9] = -(cStack_417 == '\0');
    auVar33[10] = -(cStack_416 == '\0');
    auVar33[0xb] = -(cStack_415 == '\0');
    auVar33[0xc] = -(cStack_414 == '\0');
    auVar33[0xd] = -(cStack_413 == '\0');
    auVar33[0xe] = -(cStack_412 == 'z');
    auVar33[0xf] = -(cStack_411 == '+');
    if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ee5;
    auVar34[0] = -(cStack_430 == '\0');
    auVar34[1] = -(cStack_42f == '\0');
    auVar34[2] = -(cStack_42e == '\0');
    auVar34[3] = -(cStack_42d == '\0');
    auVar34[4] = -(cStack_42c == '\0');
    auVar34[5] = -(cStack_42b == '\0');
    auVar34[6] = -(cStack_42a == '\0');
    auVar34[7] = -(cStack_429 == '\0');
    auVar34[8] = -(cStack_428 == '\0');
    auVar34[9] = -(cStack_427 == '\0');
    auVar34[10] = -(cStack_426 == '\0');
    auVar34[0xb] = -(cStack_425 == '\0');
    auVar34[0xc] = -(cStack_424 == '\0');
    auVar34[0xd] = -(cStack_423 == '\0');
    auVar34[0xe] = -(cStack_422 == ' ');
    auVar34[0xf] = -(cStack_421 == '_');
    if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar35[0] = -(cStack_440 == '\0');
      auVar35[1] = -(cStack_43f == '\0');
      auVar35[2] = -(cStack_43e == '\0');
      auVar35[3] = -(cStack_43d == '\0');
      auVar35[4] = -(cStack_43c == '\0');
      auVar35[5] = -(cStack_43b == '\0');
      auVar35[6] = -(cStack_43a == '\0');
      auVar35[7] = -(cStack_439 == '\0');
      auVar35[8] = -(cStack_438 == '\0');
      auVar35[9] = -(cStack_437 == '\0');
      auVar35[10] = -(cStack_436 == '\0');
      auVar35[0xb] = -(cStack_435 == '\0');
      auVar35[0xc] = -(cStack_434 == '\0');
      auVar35[0xd] = -(cStack_433 == '\0');
      auVar35[0xe] = -(cStack_432 == '>');
      auVar35[0xf] = -(cStack_431 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar35[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128eef;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128ee5:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128eef:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)pcVar2,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_to_string__scientific (void)
{
   char bid_string[BSON_DECIMAL128_STRING];

   bson_decimal128_t huge;     /* 1.000000000000000000000000000000000E+6144 */
   bson_decimal128_t tiny;     /* 1E-6176 */
   bson_decimal128_t neg_tiny; /* -1E-6176 */
   bson_decimal128_t large;    /* 9.999987654321E+112 */
   bson_decimal128_t largest;  /* 9.999999999999999999999999999999999E+6144 */
   bson_decimal128_t tiniest;  /* 9.999999999999999999999999999999999E-6143 */
   bson_decimal128_t trailing_zero;            /* 1.050E9 */
   bson_decimal128_t one_trailing_zero;        /* 1.050E4 */
   bson_decimal128_t move_decimal;             /* 105 */
   bson_decimal128_t move_decimal_after;       /* 1.05E3 */
   bson_decimal128_t trailing_zero_no_decimal; /* 1E3 */

   DECIMAL128_FROM_ULLS (huge, 0x5ffe314dc6448d93, 0x38c15b0a00000000);
   DECIMAL128_FROM_ULLS (tiny, 0x0000000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (neg_tiny, 0x8000000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (large, 0x3108000000000000, 0x000009184db63eb1);
   DECIMAL128_FROM_ULLS (largest, 0x5fffed09bead87c0, 0x378d8e63ffffffff);
   DECIMAL128_FROM_ULLS (tiniest, 0x0001ed09bead87c0, 0x378d8e63ffffffff);
   DECIMAL128_FROM_ULLS (trailing_zero, 0x304c000000000000, 0x000000000000041a);
   DECIMAL128_FROM_ULLS (
      one_trailing_zero, 0x3042000000000000, 0x000000000000041a);
   DECIMAL128_FROM_ULLS (move_decimal, 0x3040000000000000, 0x0000000000000069);
   DECIMAL128_FROM_ULLS (
      move_decimal_after, 0x3042000000000000, 0x0000000000000069);
   DECIMAL128_FROM_ULLS (
      trailing_zero_no_decimal, 0x3046000000000000, 0x0000000000000001);

   bson_decimal128_to_string (&huge, bid_string);
   BSON_ASSERT (!strcmp ("1.000000000000000000000000000000000E+6144", bid_string));

   bson_decimal128_to_string (&tiny, bid_string);
   BSON_ASSERT (!strcmp ("1E-6176", bid_string));

   bson_decimal128_to_string (&neg_tiny, bid_string);
   BSON_ASSERT (!strcmp ("-1E-6176", bid_string));

   bson_decimal128_to_string (&neg_tiny, bid_string);
   BSON_ASSERT (!strcmp ("-1E-6176", bid_string));

   bson_decimal128_to_string (&large, bid_string);
   BSON_ASSERT (!strcmp ("9.999987654321E+112", bid_string));

   bson_decimal128_to_string (&largest, bid_string);
   BSON_ASSERT (!strcmp ("9.999999999999999999999999999999999E+6144", bid_string));

   bson_decimal128_to_string (&tiniest, bid_string);
   BSON_ASSERT (!strcmp ("9.999999999999999999999999999999999E-6143", bid_string));

   bson_decimal128_to_string (&trailing_zero, bid_string);
   BSON_ASSERT (!strcmp ("1.050E+9", bid_string));

   bson_decimal128_to_string (&one_trailing_zero, bid_string);
   BSON_ASSERT (!strcmp ("1.050E+4", bid_string));

   bson_decimal128_to_string (&move_decimal, bid_string);
   BSON_ASSERT (!strcmp ("105", bid_string));

   bson_decimal128_to_string (&move_decimal_after, bid_string);
   BSON_ASSERT (!strcmp ("1.05E+3", bid_string));

   bson_decimal128_to_string (&trailing_zero_no_decimal, bid_string);
   BSON_ASSERT (!strcmp ("1E+3", bid_string));
}